

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O2

VOID PAL_Leave(PAL_Boundary boundary)

{
  CPalThread *this;
  PAL_Boundary in_ESI;
  
  if (PAL_InitializeChakraCoreCalled) {
    this = CorUnix::InternalGetCurrentThread();
    CorUnix::CPalThread::Leave(this,in_ESI);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

VOID
PALAPI
PAL_Leave(PAL_Boundary boundary)
{
    ENTRY("PAL_Leave(boundary=%u)\n", boundary);

    CPalThread *pThread = InternalGetCurrentThread();
    // We ignore the return code.  This call should only fail on internal
    // error, and we assert at the actual failure.
    pThread->Leave(boundary);

    LOGEXIT("PAL_Leave returns\n");
}